

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O2

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::CreateInputStream2
          (DefaultShaderSourceStreamFactory *this,Char *Name,
          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,IFileStream **ppStream)

{
  pointer pbVar1;
  RefCntAutoPtr<Diligent::BasicFileStream> RVar2;
  bool bVar3;
  Char *__rhs;
  pointer __lhs;
  RefCntAutoPtr<Diligent::BasicFileStream> pFileStream;
  Char *Name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> FullPath;
  anon_class_1_0_00000001 local_38 [8];
  
  pFileStream.m_pObject = (BasicFileStream *)0x0;
  Name_local = Name;
  bVar3 = BasicFileSystem::IsPathAbsolute(Name);
  if (bVar3) {
    CreateInputStream2::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&FullPath,Name);
    RefCntAutoPtr<Diligent::BasicFileStream>::operator=
              (&pFileStream,(RefCntAutoPtr<Diligent::BasicFileStream> *)&FullPath);
    RefCntAutoPtr<Diligent::BasicFileStream>::Release
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)&FullPath);
  }
  else {
    __lhs = (this->m_SearchDirectories).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->m_SearchDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (__lhs == pbVar1) break;
      if ((*Name == '\\') || (__rhs = Name, *Name == '/')) {
        __rhs = Name + 1;
      }
      std::operator+(&FullPath,__lhs,__rhs);
      CreateInputStream2::anon_class_1_0_00000001::operator()(local_38,FullPath._M_dataplus._M_p);
      RefCntAutoPtr<Diligent::BasicFileStream>::operator=
                (&pFileStream,(RefCntAutoPtr<Diligent::BasicFileStream> *)local_38);
      RefCntAutoPtr<Diligent::BasicFileStream>::Release
                ((RefCntAutoPtr<Diligent::BasicFileStream> *)local_38);
      RVar2 = pFileStream;
      std::__cxx11::string::~string((string *)&FullPath);
      __lhs = __lhs + 1;
    } while (RVar2.m_pObject == (BasicFileStream *)0x0);
  }
  if (pFileStream.m_pObject == (BasicFileStream *)0x0) {
    *ppStream = (IFileStream *)0x0;
    if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) ==
        CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_NONE) {
      LogError<false,char[47],char_const*>
                (false,"CreateInputStream2",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                 ,0x76,(char (*) [47])"Failed to create input stream for source file ",&Name_local);
    }
  }
  else {
    (**((pFileStream.m_pObject)->super_ObjectBase<Diligent::IFileStream>).
       super_RefCountedObject<Diligent::IFileStream>.super_IFileStream.super_IObject._vptr_IObject)
              (pFileStream.m_pObject,IID_FileStream,ppStream);
  }
  RefCntAutoPtr<Diligent::BasicFileStream>::Release(&pFileStream);
  return;
}

Assistant:

void DefaultShaderSourceStreamFactory::CreateInputStream2(const Char*                             Name,
                                                          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,
                                                          IFileStream**                           ppStream)
{
    auto CreateFileStream = [](const char* Path) //
    {
        RefCntAutoPtr<BasicFileStream> pFileStream;
        if (FileSystem::FileExists(Path))
        {
            pFileStream = BasicFileStream::Create(Path, EFileAccessMode::Read);
            if (!pFileStream->IsValid())
                pFileStream.Release();
        }
        return pFileStream;
    };

    RefCntAutoPtr<BasicFileStream> pFileStream;
    if (FileSystem::IsPathAbsolute(Name))
    {
        pFileStream = CreateFileStream(Name);
    }
    else
    {
        for (const auto& SearchDir : m_SearchDirectories)
        {
            const auto FullPath = SearchDir + ((Name[0] == '\\' || Name[0] == '/') ? Name + 1 : Name);
            pFileStream         = CreateFileStream(FullPath.c_str());
            if (pFileStream)
                break;
        }
    }

    if (pFileStream)
    {
        pFileStream->QueryInterface(IID_FileStream, reinterpret_cast<IObject**>(ppStream));
    }
    else
    {
        *ppStream = nullptr;
        if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) == 0)
        {
            LOG_ERROR("Failed to create input stream for source file ", Name);
        }
    }
}